

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  ZSTD_cwksp ws;
  ZSTD_cwksp local_78;
  
  lVar3 = 4L << ((byte)cParams.chainLog & 0x3f);
  if (cParams.strategy == ZSTD_fast) {
    lVar3 = 0;
  }
  lVar2 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2b40;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar2 = 0x2b40;
  }
  if (((ulong)workspace & 7) == 0) {
    local_78.workspaceEnd = (void *)((long)workspace + workspaceSize);
    local_78.phase = ZSTD_cwksp_alloc_objects;
    local_78.allocFailed = 0;
    local_78.workspace = workspace;
    local_78.objectEnd = workspace;
    local_78.tableEnd = workspace;
    local_78.tableValidEnd = workspace;
    local_78.allocStart = local_78.workspaceEnd;
    ZSTD_cwksp_assert_internal_consistency(&local_78);
    local_78.workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(&local_78);
    ZSTD_cwksp_assert_internal_consistency(&local_78);
    if ((long)workspaceSize < 0x1340) {
      local_78.allocFailed = 1;
      workspace = (ZSTD_CDict *)0x0;
    }
    else {
      local_78.objectEnd = (void *)((long)workspace + 0x1340);
      local_78.tableEnd = local_78.objectEnd;
      local_78.tableValidEnd = local_78.objectEnd;
    }
    if ((ZSTD_CDict *)workspace != (ZSTD_CDict *)0x0) {
      (((ZSTD_CDict *)workspace)->workspace).tableValidEnd = local_78.tableValidEnd;
      (((ZSTD_CDict *)workspace)->workspace).allocStart = local_78.allocStart;
      (((ZSTD_CDict *)workspace)->workspace).allocFailed = local_78.allocFailed;
      (((ZSTD_CDict *)workspace)->workspace).workspaceOversizedDuration =
           local_78.workspaceOversizedDuration;
      *(ulong *)&(((ZSTD_CDict *)workspace)->workspace).phase =
           CONCAT44(local_78._60_4_,local_78.phase);
      (((ZSTD_CDict *)workspace)->workspace).workspace = local_78.workspace;
      (((ZSTD_CDict *)workspace)->workspace).workspaceEnd = local_78.workspaceEnd;
      (((ZSTD_CDict *)workspace)->workspace).objectEnd = local_78.objectEnd;
      (((ZSTD_CDict *)workspace)->workspace).tableEnd = local_78.tableEnd;
      if ((ulong)(lVar3 + (4L << ((byte)cParams.hashLog & 0x3f)) + lVar2) <= workspaceSize) {
        sVar1 = ZSTD_initCDict_internal
                          ((ZSTD_CDict *)workspace,dict,dictSize,dictLoadMethod,dictContentType,
                           cParams);
        if (sVar1 < 0xffffffffffffff89) {
          return (ZSTD_CDict *)workspace;
        }
        return (ZSTD_CDict *)0x0;
      }
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}